

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

void Assimp::IFC::FindAdjacentContours(iterator current,ContourVector *contours)

{
  double *pdVar1;
  BoundingBox *ibb;
  ulong *puVar2;
  double dVar3;
  pointer pPVar4;
  bool bVar5;
  pointer paVar6;
  pointer paVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pPVar11;
  ulong uVar12;
  long lVar13;
  const_iterator __position;
  const_iterator __position_00;
  IfcVector2 n0;
  IfcVector2 isect1;
  IfcVector2 isect0;
  IfcVector2 n1;
  IfcVector2 m1;
  IfcVector2 m0;
  bool local_e9;
  pointer local_e8;
  SkipList *local_e0;
  IfcVector2 local_d8;
  BoundingBox *local_c8;
  pointer local_c0;
  IfcVector2 local_b8;
  IfcVector2 local_a8;
  IfcVector2 local_98;
  pointer local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  IfcVector2 local_58;
  IfcVector2 local_48;
  
  pPVar11 = (contours->
            super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_80 = (contours->
             super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar11 != local_80) {
    local_c8 = &(current._M_current)->bb;
    local_e0 = &(current._M_current)->skiplist;
    local_e8 = current._M_current;
    do {
      if ((pPVar11->contour).
          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pPVar11->contour).
          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (pPVar11 != local_e8) {
          ibb = &pPVar11->bb;
          dVar3 = (pPVar11->bb).second.x;
          if (((((local_c8->first).x <= dVar3 && dVar3 != (local_c8->first).x) &&
               (dVar3 = (local_e8->bb).second.x, (ibb->first).x <= dVar3 && dVar3 != (ibb->first).x)
               ) && (dVar3 = (pPVar11->bb).second.y, pdVar1 = &(local_e8->bb).first.y,
                    *pdVar1 <= dVar3 && dVar3 != *pdVar1)) &&
             (dVar3 = (local_e8->bb).second.y, pdVar1 = &(pPVar11->bb).first.y,
             *pdVar1 <= dVar3 && dVar3 != *pdVar1)) {
            __assert_fail("is_me || !BoundingBoxesOverlapping(bb, ibb)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                          ,0x2c6,
                          "void Assimp::IFC::FindAdjacentContours(ContourVector::iterator, const ContourVector &)"
                         );
          }
          bVar5 = BoundingBoxesAdjacent(local_c8,ibb);
          if (!bVar5) goto LAB_005c4972;
        }
        paVar6 = (local_e8->contour).
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        paVar7 = (local_e8->contour).
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((long)paVar7 - (long)paVar6 != 0) {
          uVar10 = (long)paVar7 - (long)paVar6 >> 4;
          uVar8 = 0;
          local_c0 = pPVar11;
          do {
            uVar9 = uVar8 + 1;
            uVar12 = 0;
            if (uVar9 != uVar10) {
              uVar12 = uVar9;
            }
            local_d8.x = paVar6[uVar8].x;
            local_d8.y = paVar6[uVar8].y;
            local_98.x = paVar6[uVar12].x;
            local_98.y = paVar6[uVar12].y;
            uVar10 = uVar8;
            if (pPVar11 != local_e8) {
              uVar10 = (long)(pPVar11->contour).
                             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar11->contour).
                             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4;
            }
            if (uVar10 != 0) {
              lVar13 = 0;
              uVar12 = 0;
              local_78 = local_98.y;
              local_70 = local_98.x;
              local_68 = local_d8.y;
              local_60 = local_d8.x;
              do {
                if ((pPVar11 == local_e8) && (uVar8 <= uVar12)) {
                  __assert_fail("&mcontour != &ncontour || m < n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                                ,0x2d7,
                                "void Assimp::IFC::FindAdjacentContours(ContourVector::iterator, const ContourVector &)"
                               );
                }
                paVar6 = (pPVar11->contour).
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pdVar1 = (double *)((long)&paVar6->x + lVar13);
                local_48.x = *pdVar1;
                local_48.y = pdVar1[1];
                uVar12 = uVar12 + 1;
                local_58.x = paVar6[uVar12 % (ulong)((long)(pPVar11->contour).
                                                                                                                      
                                                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)paVar6 >> 4)].x;
                local_58.y = paVar6[uVar12 % (ulong)((long)(pPVar11->contour).
                                                                                                                      
                                                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)paVar6 >> 4)].y;
                local_a8.x = 0.0;
                local_a8.y = 0.0;
                local_b8.x = 0.0;
                local_b8.y = 0.0;
                bVar5 = IntersectingLineSegments
                                  (&local_d8,&local_98,&local_48,&local_58,&local_a8,&local_b8);
                pPVar4 = local_e8;
                uVar9 = uVar8;
                if (bVar5) {
                  if ((local_a8.x - local_60) * (local_a8.x - local_60) +
                      (local_a8.y - local_68) * (local_a8.y - local_68) <= 1.1920928955078125e-07) {
                    uVar9 = uVar8 + 0x3f;
                    if (-1 < (long)uVar8) {
                      uVar9 = uVar8;
                    }
                    puVar2 = (local_e0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                             ((long)uVar9 >> 6) +
                             (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) +
                             0xffffffffffffffff;
                    *puVar2 = *puVar2 | 1L << ((byte)uVar8 & 0x3f);
                  }
                  else {
                    uVar9 = uVar8 + 1;
                    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::insert
                              (&local_e8->contour,
                               (local_e8->contour).
                               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar9,&local_a8);
                    uVar8 = uVar8 + 0x40;
                    if (-1 < (long)uVar9) {
                      uVar8 = uVar9;
                    }
                    __position.super__Bit_iterator_base._M_p =
                         (long)((pPVar4->skiplist).super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                _M_p + ((long)uVar8 >> 6) +
                                       (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) +
                                       0xffffffffffffffff);
                    __position.super__Bit_iterator_base._M_offset = (uint)uVar9 & 0x3f;
                    local_e9 = true;
                    __position.super__Bit_iterator_base._12_4_ = 0;
                    std::vector<bool,_std::allocator<bool>_>::insert(local_e0,__position,&local_e9);
                    uVar8 = uVar9;
                  }
                  pPVar4 = local_e8;
                  uVar9 = uVar8;
                  pPVar11 = local_c0;
                  if (1.1920928955078125e-07 <
                      (local_b8.x - local_70) * (local_b8.x - local_70) +
                      (local_b8.y - local_78) * (local_b8.y - local_78)) {
                    uVar9 = uVar8 + 1;
                    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::insert
                              (&local_e8->contour,
                               (local_e8->contour).
                               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar9,&local_b8);
                    uVar8 = uVar8 + 0x40;
                    if (-1 < (long)uVar9) {
                      uVar8 = uVar9;
                    }
                    __position_00.super__Bit_iterator_base._M_p =
                         (long)((pPVar4->skiplist).super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                _M_p + ((long)uVar8 >> 6) +
                                       (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) +
                                       0xffffffffffffffff);
                    __position_00.super__Bit_iterator_base._M_offset = (uint)uVar9 & 0x3f;
                    local_e9 = false;
                    __position_00.super__Bit_iterator_base._12_4_ = 0;
                    std::vector<bool,_std::allocator<bool>_>::insert
                              (local_e0,__position_00,&local_e9);
                    pPVar11 = local_c0;
                  }
                }
                lVar13 = lVar13 + 0x10;
                uVar8 = uVar9;
              } while (uVar10 != uVar12);
              paVar6 = (local_e8->contour).
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar7 = (local_e8->contour).
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              uVar9 = uVar9 + 1;
            }
            uVar10 = (long)paVar7 - (long)paVar6 >> 4;
            uVar8 = uVar9;
          } while (uVar9 < uVar10);
        }
      }
LAB_005c4972:
      pPVar11 = pPVar11 + 1;
    } while (pPVar11 != local_80);
  }
  return;
}

Assistant:

void FindAdjacentContours(ContourVector::iterator current, const ContourVector& contours)
{
    const IfcFloat sqlen_epsilon = static_cast<IfcFloat>(Math::getEpsilon<float>());
    const BoundingBox& bb = (*current).bb;

    // What is to be done here is to populate the skip lists for the contour
    // and to add necessary padding points when needed.
    SkipList& skiplist = (*current).skiplist;

    // First step to find possible adjacent contours is to check for adjacent bounding
    // boxes. If the bounding boxes are not adjacent, the contours lines cannot possibly be.
    for (ContourVector::const_iterator it = contours.begin(), end = contours.end(); it != end; ++it) {
        if ((*it).IsInvalid()) {
            continue;
        }

        // this left here to make clear we also run on the current contour
        // to check for overlapping contour segments (which can happen due
        // to projection artifacts).
        //if(it == current) {
        //  continue;
        //}

        const bool is_me = it == current;

        const BoundingBox& ibb = (*it).bb;

        // Assumption: the bounding boxes are pairwise disjoint or identical
        ai_assert(is_me || !BoundingBoxesOverlapping(bb, ibb));

        if (is_me || BoundingBoxesAdjacent(bb, ibb)) {

            // Now do a each-against-everyone check for intersecting contour
            // lines. This obviously scales terribly, but in typical real
            // world Ifc files it will not matter since most windows that
            // are adjacent to each others are rectangular anyway.

            Contour& ncontour = (*current).contour;
            const Contour& mcontour = (*it).contour;

            for (size_t n = 0; n < ncontour.size(); ++n) {
                const IfcVector2 n0 = ncontour[n];
                const IfcVector2 n1 = ncontour[(n+1) % ncontour.size()];

                for (size_t m = 0, mend = (is_me ? n : mcontour.size()); m < mend; ++m) {
                    ai_assert(&mcontour != &ncontour || m < n);

                    const IfcVector2 m0 = mcontour[m];
                    const IfcVector2 m1 = mcontour[(m+1) % mcontour.size()];

                    IfcVector2 isect0, isect1;
                    if (IntersectingLineSegments(n0,n1, m0, m1, isect0, isect1)) {

                        if ((isect0 - n0).SquareLength() > sqlen_epsilon) {
                            ++n;

                            ncontour.insert(ncontour.begin() + n, isect0);
                            skiplist.insert(skiplist.begin() + n, true);
                        }
                        else {
                            skiplist[n] = true;
                        }

                        if ((isect1 - n1).SquareLength() > sqlen_epsilon) {
                            ++n;

                            ncontour.insert(ncontour.begin() + n, isect1);
                            skiplist.insert(skiplist.begin() + n, false);
                        }
                    }
                }
            }
        }
    }
}